

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  char *pcVar1;
  pointer pcVar2;
  auto_ptr<cmMakefile> aVar3;
  pointer pBVar4;
  bool bVar5;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ostream *poVar9;
  pointer pbVar10;
  auto_ptr<cmMakefile> mf;
  RegularExpression currentRegex;
  string currentRegexString;
  string ignoreTargetsRegexes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmake cm;
  cmGlobalGenerator ggi;
  auto_ptr<cmMakefile> local_9e8;
  cmLocalGenerator *local_9e0;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [168];
  char *local_920;
  _Base_ptr local_908;
  _Base_ptr local_900;
  undefined1 local_8f8 [24];
  pointer local_8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c8;
  cmake local_8b0;
  undefined1 local_5f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8 [91];
  
  cmake::cmake(&local_8b0,RoleScript);
  local_5f8._0_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmake::SetHomeDirectory(&local_8b0,(string *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._0_8_ != local_5e8) {
    operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
  }
  local_5f8._0_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmake::SetHomeOutputDirectory(&local_8b0,(string *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._0_8_ != local_5e8) {
    operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
  }
  local_5e8[0]._M_allocated_capacity = local_8b0.CurrentSnapshot.Position.Position;
  local_5f8._0_8_ = local_8b0.CurrentSnapshot.State;
  local_5f8._8_8_ = local_8b0.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_5f8);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_5f8,&local_8b0);
  this_00 = (cmMakefile *)operator_new(0x760);
  local_9c8._0_8_ = local_8b0.CurrentSnapshot.Position.Position;
  local_9d8._0_8_ = local_8b0.CurrentSnapshot.State;
  local_9d8._8_8_ = local_8b0.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_5f8,(cmStateSnapshot *)local_9d8);
  local_9e8.x_ = this_00;
  pcVar6 = cmGlobalGenerator::CreateLocalGenerator((cmGlobalGenerator *)local_5f8,this_00);
  bVar5 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar5) {
    bVar5 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (!bVar5) goto LAB_003f358d;
  }
  bVar5 = cmMakefile::ReadListFile(local_9e8.x_,settingsFileName);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reading GraphViz options file: ",0x1f);
    if (settingsFileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6a16b0);
    }
    else {
      sVar7 = strlen(settingsFileName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,settingsFileName,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    aVar3.x_ = local_9e8.x_;
    local_9e0 = pcVar6;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_GRAPH_TYPE","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphType)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar8);
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_GRAPH_NAME","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphName)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphName,0,pcVar1,(ulong)pcVar8);
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_GRAPH_HEADER","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphHeader)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphHeader,0,pcVar1,(ulong)pcVar8);
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_NODE_PREFIX","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphNodePrefix)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphNodePrefix,0,pcVar1,(ulong)pcVar8);
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_EXECUTABLES","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    aVar3.x_ = local_9e8.x_;
    if (pcVar8 != (char *)0x0) {
      local_9d8._0_8_ = (cmState *)local_9c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_EXECUTABLES","")
      ;
      bVar5 = cmMakefile::IsOn(aVar3.x_,(string *)local_9d8);
      this->GenerateForExecutables = bVar5;
      if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
        operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
      }
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_STATIC_LIBS","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    aVar3.x_ = local_9e8.x_;
    if (pcVar8 != (char *)0x0) {
      local_9d8._0_8_ = (cmState *)local_9c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_STATIC_LIBS","")
      ;
      bVar5 = cmMakefile::IsOn(aVar3.x_,(string *)local_9d8);
      this->GenerateForStaticLibs = bVar5;
      if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
        operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
      }
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_SHARED_LIBS","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    aVar3.x_ = local_9e8.x_;
    if (pcVar8 != (char *)0x0) {
      local_9d8._0_8_ = (cmState *)local_9c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_SHARED_LIBS","")
      ;
      bVar5 = cmMakefile::IsOn(aVar3.x_,(string *)local_9d8);
      this->GenerateForSharedLibs = bVar5;
      if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
        operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
      }
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_MODULE_LIBS","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    aVar3.x_ = local_9e8.x_;
    if (pcVar8 != (char *)0x0) {
      local_9d8._0_8_ = (cmState *)local_9c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_MODULE_LIBS","")
      ;
      bVar5 = cmMakefile::IsOn(aVar3.x_,(string *)local_9d8);
      this->GenerateForModuleLibs = bVar5;
      if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
        operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
      }
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"GRAPHVIZ_EXTERNAL_LIBS","")
    ;
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    aVar3.x_ = local_9e8.x_;
    if (pcVar8 != (char *)0x0) {
      local_9d8._0_8_ = (cmState *)local_9c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9d8,"GRAPHVIZ_EXTERNAL_LIBS","");
      bVar5 = cmMakefile::IsOn(aVar3.x_,(string *)local_9d8);
      this->GenerateForExternals = bVar5;
      if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
        operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
      }
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9d8,"GRAPHVIZ_GENERATE_PER_TARGET","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    aVar3.x_ = local_9e8.x_;
    if (pcVar8 != (char *)0x0) {
      local_9d8._0_8_ = (cmState *)local_9c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9d8,"GRAPHVIZ_GENERATE_PER_TARGET","");
      bVar5 = cmMakefile::IsOn(aVar3.x_,(string *)local_9d8);
      this->GeneratePerTarget = bVar5;
      if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
        operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
      }
    }
    aVar3.x_ = local_9e8.x_;
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9d8,"GRAPHVIZ_GENERATE_DEPENDERS","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    aVar3.x_ = local_9e8.x_;
    if (pcVar8 != (char *)0x0) {
      local_9d8._0_8_ = (cmState *)local_9c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9d8,"GRAPHVIZ_GENERATE_DEPENDERS","");
      bVar5 = cmMakefile::IsOn(aVar3.x_,(string *)local_9d8);
      this->GenerateDependers = bVar5;
      if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
        operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
      }
    }
    aVar3.x_ = local_9e8.x_;
    local_8f8._16_8_ = &local_8d8;
    local_8e0 = (pointer)0x0;
    local_8d8._M_local_buf[0] = '\0';
    local_9d8._0_8_ = (cmState *)local_9c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9d8,"GRAPHVIZ_IGNORE_TARGETS","");
    pcVar8 = cmMakefile::GetDefinition(aVar3.x_,(string *)local_9d8);
    if ((cmState *)local_9d8._0_8_ != (cmState *)local_9c8) {
      operator_delete((void *)local_9d8._0_8_,local_9c8._0_8_ + 1);
    }
    pBVar4 = local_8e0;
    pcVar6 = local_9e0;
    if (pcVar8 != (char *)0x0) {
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)(local_8f8 + 0x10),0,(char *)pBVar4,(ulong)pcVar8);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if (local_8e0 != (pointer)0x0) {
      local_8c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_8c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_8c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument((string *)(local_8f8 + 0x10),&local_8c8,false);
      if (local_8c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_8c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_8c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar2 = (pbVar10->_M_dataplus)._M_p;
          local_908 = (_Base_ptr)local_8f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_908,pcVar2,pcVar2 + pbVar10->_M_string_length);
          local_920 = (char *)0x0;
          bVar5 = cmsys::RegularExpression::compile
                            ((RegularExpression *)local_9d8,(char *)local_908);
          if (!bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not compile bad regex \"",0x1d);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_908,(long)local_900);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
          }
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->TargetsToIgnoreRegex,(RegularExpression *)local_9d8);
          if (local_920 != (char *)0x0) {
            operator_delete__(local_920);
          }
          if (local_908 != (_Base_ptr)local_8f8) {
            operator_delete(local_908,local_8f8._0_8_ + 1);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_8c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_8c8);
      pcVar6 = local_9e0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._16_8_ != &local_8d8) {
      operator_delete((void *)local_8f8._16_8_,
                      CONCAT71(local_8d8._M_allocated_capacity._1_7_,local_8d8._M_local_buf[0]) + 1)
      ;
    }
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0);
  }
LAB_003f358d:
  if (pcVar6 != (cmLocalGenerator *)0x0) {
    (*pcVar6->_vptr_cmLocalGenerator[1])(pcVar6);
  }
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_9e8);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_5f8);
  cmake::~cmake(&local_8b0);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&ggi, cm.GetCurrentSnapshot()));
  CM_AUTO_PTR<cmLocalGenerator> lg(ggi.CreateLocalGenerator(mf.get()));

  const char* inFileName = settingsFileName;

  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf->ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  {                                                                           \
    const char* value = mf->GetDefinition(cmakeDefinition);                   \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  {                                                                           \
    const char* value = mf->GetDefinition(cmakeDefinition);                   \
    if (value) {                                                              \
      (var) = mf->IsOn(cmakeDefinition);                                      \
    }                                                                         \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::vector<std::string>::const_iterator itvIt =
           ignoreTargetsRegExVector.begin();
         itvIt != ignoreTargetsRegExVector.end(); ++itvIt) {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str())) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
    }
  }
}